

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsp.cc
# Opt level: O0

void bsp_hpput(bsp_pid_t pid,void *src,void *dst,bsp_size_t offset,bsp_size_t nbytes)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  Memslot slot;
  Memblock *pMVar4;
  Memblock dst_slot;
  Memslot dst_slot_id;
  undefined1 local_48 [8];
  TicToc t;
  bsp_size_t nbytes_local;
  bsp_size_t offset_local;
  void *dst_local;
  void *src_local;
  bsp_pid_t pid_local;
  
  t.m_nbytes._0_4_ = nbytes;
  t.m_nbytes._4_4_ = offset;
  bsplib::TicToc::TicToc((TicToc *)local_48,HPPUT,(long)nbytes);
  if ((s_spmd == (Spmd *)0x0) || (bVar2 = bsplib::Spmd::closed(s_spmd), bVar2)) {
    bsp_abort("bsp_hpput: can only be called within SPMD section\n");
  }
  if ((bsp_size_t)t.m_nbytes != 0) {
    if ((pid < 0) || (iVar3 = bsplib::Spmd::nprocs(s_spmd), iVar3 < pid)) {
      bsp_abort("bsp_hpput: The destination process ID does not exist\n");
    }
    if (t.m_nbytes._4_4_ < 0) {
      bsp_abort("bsp_hpput: The offset was negative, which is illegal\n");
    }
    if ((bsp_size_t)t.m_nbytes < 0) {
      bsp_abort("bsp_hpput: The size was negative, which is illegal\n");
    }
    if (dst == (void *)0x0) {
      bsp_abort("bsp_hpput: Destination address cannot be identified by NULL\n");
    }
    slot = lookup_usable_reg(dst,"bsp_hpput");
    pMVar4 = bsplib::Rdma::slot(s_rdma,pid,slot);
    uVar1 = pMVar4->size;
    if (uVar1 < (ulong)(long)(t.m_nbytes._4_4_ + (bsp_size_t)t.m_nbytes)) {
      bsp_abort("bsp_hpput: Writes %zu bytes beyond registered range [%p,%p+%zu) at process %d\n",
                (long)(t.m_nbytes._4_4_ + (bsp_size_t)t.m_nbytes) - uVar1,pMVar4->addr,pMVar4->addr,
                uVar1,(ulong)(uint)pid);
    }
    iVar3 = bsplib::Spmd::pid(s_spmd);
    if (pid == iVar3) {
      memcpy((void *)((long)dst + (long)t.m_nbytes._4_4_),src,(long)(bsp_size_t)t.m_nbytes);
    }
    else {
      bsplib::Rdma::hpput(s_rdma,src,pid,slot,(long)t.m_nbytes._4_4_,(long)(bsp_size_t)t.m_nbytes);
    }
  }
  bsplib::TicToc::~TicToc((TicToc *)local_48);
  return;
}

Assistant:

void bsp_hpput( bsp_pid_t pid, const void * src, void * dst,
        bsp_size_t offset, bsp_size_t nbytes )
{
#ifdef PROFILE
    TicToc t( TicToc::HPPUT, nbytes );
#endif

    if (!s_spmd || s_spmd->closed())
        bsp_abort("bsp_hpput: can only be called within SPMD section\n");

    if (nbytes == 0) // ignore any empty writes
        return;

    if (pid < 0 || pid > s_spmd->nprocs())
        bsp_abort("bsp_hpput: The destination process ID does not exist\n");

    if (offset < 0)
        bsp_abort("bsp_hpput: The offset was negative, which is illegal\n");
    
    if (nbytes< 0)
        bsp_abort("bsp_hpput: The size was negative, which is illegal\n");

    if ( dst == NULL )
        bsp_abort("bsp_hpput: Destination address cannot be identified by NULL\n");

    bsplib::Rdma::Memslot dst_slot_id = lookup_usable_reg( dst, "bsp_hpput" );
    bsplib::Rdma::Memblock dst_slot = s_rdma->slot( pid, dst_slot_id );

    if ( size_t(offset + nbytes) > dst_slot.size )
        bsp_abort("bsp_hpput: Writes %zu bytes beyond registered "
                  "range [%p,%p+%zu) at process %d\n",
                  offset + nbytes - dst_slot.size,
                  dst_slot.addr, dst_slot.addr, dst_slot.size, pid );

    if (pid == s_spmd->pid() )
        std::memcpy(static_cast<char *>(dst) + offset, src, nbytes);
    else
        s_rdma->hpput( src, pid, dst_slot_id, offset, nbytes );

}